

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdistancefield.cpp
# Opt level: O0

void __thiscall
QDistanceField::setGlyph
          (QDistanceField *this,QFontEngine *fontEngine,glyph_t glyph,bool doubleResolution)

{
  QDistanceFieldData *pQVar1;
  glyph_t in_EDX;
  QRectF *in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QPainterPath path;
  QFixedPoint position;
  QDistanceFieldData *in_stack_ffffffffffffff38;
  QSharedDataPointer<QDistanceFieldData> *this_00;
  QPainterPath *this_01;
  undefined1 doubleResolution_00;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  QSharedDataPointer<QDistanceFieldData> *local_20;
  QPainterPath local_18;
  glyph_t local_c;
  long local_8;
  
  doubleResolution_00 = (undefined1)((ulong)in_RDI >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QSharedDataPointer<QDistanceFieldData> *)&DAT_aaaaaaaaaaaaaaaa;
  local_18.d_ptr.d.ptr = (QExplicitlySharedDataPointer<QPainterPathPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  this_01 = &local_18;
  local_c = in_EDX;
  QFixedPoint::QFixedPoint((QFixedPoint *)&DAT_aaaaaaaaaaaaaaaa);
  local_20 = this_00;
  QPainterPath::QPainterPath((QPainterPath *)0x705de7);
  QFlags<QTextItem::RenderFlag>::QFlags((QFlags<QTextItem::RenderFlag> *)0x705e09);
  (**(code **)((long)in_RSI->xp + 0x78))(in_RSI,&local_c,this_01,1,&local_20,0);
  QPainterPath::boundingRect(this_01);
  QRectF::topLeft(in_RSI);
  ::operator-((QPointF *)in_RSI);
  QPainterPath::translate(this_01,(QPointF *)in_RSI);
  QPainterPath::setFillRule(this_01,(FillRule)((ulong)in_RSI >> 0x20));
  QDistanceFieldData::create
            ((QPainterPath *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (bool)doubleResolution_00);
  QSharedDataPointer<QDistanceFieldData>::operator=(this_00,in_stack_ffffffffffffff38);
  pQVar1 = QSharedDataPointer<QDistanceFieldData>::operator->(this_00);
  pQVar1->glyph = local_c;
  QPainterPath::~QPainterPath((QPainterPath *)0x705eee);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDistanceField::setGlyph(QFontEngine *fontEngine, glyph_t glyph, bool doubleResolution)
{
    QFixedPoint position;
    QPainterPath path;
    fontEngine->addGlyphsToPath(&glyph, &position, 1, &path, { });
    path.translate(-path.boundingRect().topLeft());
    path.setFillRule(Qt::WindingFill);

    d = QDistanceFieldData::create(path, doubleResolution);
    d->glyph = glyph;
}